

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void output_defines(void)

{
  FILE *pFVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *__ptr;
  ushort **ppuVar5;
  FILE *__stream;
  long lVar6;
  char *pcVar7;
  
  __stream = (FILE *)code_file;
  if (dflag != '\0') {
    __ptr = strdup(defines_file_name);
    for (pcVar7 = __ptr; cVar2 = *pcVar7, (long)cVar2 != 0; pcVar7 = pcVar7 + 1) {
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[cVar2] & 8) == 0) {
        *pcVar7 = '_';
      }
    }
    fprintf((FILE *)defines_file,"#ifndef _%s_\n",__ptr);
    fprintf((FILE *)defines_file,"#define _%s_\n\n",__ptr);
    free(__ptr);
    pFVar1 = defines_file;
    __stream = (FILE *)code_file;
    if ((dflag != '\0') && (__stream = (FILE *)pFVar1, include_defines == '\0')) {
      outline = outline + 2;
      fprintf((FILE *)code_file,"#include \"%s\"\n\n",defines_file_name);
      include_defines = '\x01';
    }
  }
  iVar4 = ntokens;
  for (lVar6 = 2; lVar6 < iVar4; lVar6 = lVar6 + 1) {
    pcVar7 = symbol_name[lVar6];
    iVar3 = is_C_identifier(pcVar7);
    if (iVar3 != 0) {
      fwrite("#define ",8,1,__stream);
      cVar2 = *pcVar7;
      if (cVar2 == '\"') {
        while( true ) {
          pcVar7 = pcVar7 + 1;
          if (*pcVar7 == 0x22) break;
          putc((int)*pcVar7,__stream);
        }
      }
      else {
        do {
          pcVar7 = pcVar7 + 1;
          putc((int)cVar2,__stream);
          cVar2 = *pcVar7;
        } while (cVar2 != '\0');
      }
      if (dflag == '\0') {
        outline = outline + 1;
      }
      fprintf(__stream," %d\n",(ulong)(uint)symbol_value[lVar6]);
      iVar4 = ntokens;
    }
  }
  if (dflag == '\0') {
    outline = outline + 1;
  }
  fprintf(__stream,"#define YYERRCODE %d\n",(ulong)(uint)symbol_value[1]);
  if (dflag != '\0') {
    if (location_defined != '\0' || unionized != '\0') {
      fclose((FILE *)union_file);
      union_file = (FILE *)fopen(union_file_name,"r");
      if ((FILE *)union_file == (FILE *)0x0) {
        open_error(union_file_name);
      }
      while (iVar4 = getc((FILE *)union_file), iVar4 != -1) {
        putc(iVar4,(FILE *)defines_file);
      }
      if (unionized != '\0') {
        fprintf((FILE *)defines_file,"extern YYSTYPE %slval;\n",symbol_prefix);
      }
    }
    if (dflag != '\0') {
      fwrite("#if defined(YYPOSN)\nextern YYPOSN yyposn;\n#endif\n",0x31,1,(FILE *)defines_file);
      fwrite("\n#endif\n",8,1,(FILE *)defines_file);
      return;
    }
  }
  return;
}

Assistant:

void output_defines()
{
    register int c, i;
    register char *s;
    FILE *dc_file;

    if(dflag) {
	char *p, *tmp = strdup(defines_file_name);
	for (p = tmp; *p; p++)
	    if (!isalnum(*p))
		*p = '_';
	fprintf(defines_file, "#ifndef _%s_\n", tmp);
	fprintf(defines_file, "#define _%s_\n\n", tmp);
	free(tmp);
    }

    /* VM: Print to either code file or defines file but not to both */
    dc_file = dflag ? defines_file : code_file;
    if (dflag && !include_defines) {
	outline += 2;
	fprintf(code_file, "#include \"%s\"\n\n", defines_file_name);
	include_defines = 1; }

    for (i = 2; i < ntokens; ++i)
    {
	s = symbol_name[i];
	if (is_C_identifier(s))
	{
	    fprintf(dc_file, "#define ");
	    c = *s;
	    if (c == '"')
	    {
		while ((c = *++s) != '"')
		{
		    putc(c, dc_file);
		}
	    }
	    else
	    {
		do
		{
		    putc(c, dc_file);
		}
		while ((c = *++s));
	    }
	    if (!dflag) ++outline;
	    fprintf(dc_file, " %d\n", symbol_value[i]);
	}
    }

    if (!dflag) ++outline;
    fprintf(dc_file, "#define YYERRCODE %d\n", symbol_value[1]);

    if (dflag && (unionized || location_defined))
    {
	fclose(union_file);
	union_file = fopen(union_file_name, "r");
	if (union_file == NULL) open_error(union_file_name);
	while ((c = getc(union_file)) != EOF) {
	  putc(c, defines_file);
	}
	if (unionized)
	    fprintf(defines_file, "extern YYSTYPE %slval;\n", symbol_prefix);
    }

    if(dflag) {
	fprintf(defines_file, "#if defined(YYPOSN)\n"
			      "extern YYPOSN yyposn;\n"
			      "#endif\n");
	fprintf(defines_file, "\n#endif\n");
    }
}